

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_rect.cpp
# Opt level: O0

void __thiscall CUIRect::Draw(CUIRect *this,vec4 *Color,float Rounding,int Corners)

{
  long lVar1;
  uint in_EDX;
  float *in_RSI;
  float *in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int NumQuadItems;
  float Sa3;
  float Sa2;
  float Sa1;
  float Ca3;
  float Ca2;
  float Ca1;
  float a3;
  float a2;
  float a1;
  int i;
  int NumFreeformItems;
  float r;
  CQuadItem a_QuadItems [9];
  CFreeformItem a_FreeformItems [32];
  IGraphics *in_stack_fffffffffffff950;
  CQuadItem *local_6a0;
  CFreeformItem *local_680;
  uint local_674;
  int local_64c;
  uint local_648;
  CQuadItem local_628;
  CQuadItem local_618;
  CQuadItem local_608;
  CQuadItem local_5f8;
  CQuadItem local_5e8;
  CQuadItem local_5d8;
  CQuadItem local_5c8;
  CQuadItem local_5b8;
  CQuadItem local_5a8;
  CFreeformItem local_598;
  CFreeformItem local_578;
  CFreeformItem local_558;
  CFreeformItem local_538;
  CFreeformItem local_518;
  CFreeformItem local_4f8;
  CFreeformItem local_4d8;
  CFreeformItem local_4b8;
  CQuadItem local_498 [4];
  CQuadItem CStack_458;
  CQuadItem aCStack_448 [4];
  CFreeformItem local_408 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  IGraphics::TextureClear(in_stack_fffffffffffff950);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (*in_RSI * in_RSI[3],in_RSI[1] * in_RSI[3],(ulong)(uint)(in_RSI[2] * in_RSI[3]));
  local_680 = local_408;
  do {
    IGraphics::CFreeformItem::CFreeformItem(local_680);
    local_680 = local_680 + 1;
  } while (local_680 != (CFreeformItem *)&stack0xfffffffffffffff8);
  local_648 = 0;
  for (local_64c = 0; local_64c < 8; local_64c = local_64c + 2) {
    fVar2 = (float)(local_64c + 1) / 5.092958;
    fVar3 = (float)(local_64c + 2) / 5.092958;
    fVar4 = cosf((float)local_64c / 5.092958);
    fVar5 = cosf(fVar2);
    fVar6 = cosf(fVar3);
    fVar7 = sinf((float)local_64c / 5.092958);
    fVar2 = sinf(fVar2);
    fVar3 = sinf(fVar3);
    if ((in_EDX & 1) != 0) {
      IGraphics::CFreeformItem::CFreeformItem
                (&local_4b8,*in_RDI + in_XMM0_Da,in_RDI[1] + in_XMM0_Da,
                 (1.0 - fVar4) * in_XMM0_Da + *in_RDI,(1.0 - fVar7) * in_XMM0_Da + in_RDI[1],
                 (1.0 - fVar6) * in_XMM0_Da + *in_RDI,(1.0 - fVar3) * in_XMM0_Da + in_RDI[1],
                 (1.0 - fVar5) * in_XMM0_Da + *in_RDI,(1.0 - fVar2) * in_XMM0_Da + in_RDI[1]);
      lVar1 = (long)(int)local_648;
      local_408[lVar1].m_X0 = local_4b8.m_X0;
      local_408[lVar1].m_Y0 = local_4b8.m_Y0;
      local_408[lVar1].m_X1 = local_4b8.m_X1;
      local_408[lVar1].m_Y1 = local_4b8.m_Y1;
      local_408[lVar1].m_X2 = local_4b8.m_X2;
      local_408[lVar1].m_Y2 = local_4b8.m_Y2;
      local_408[lVar1].m_X3 = local_4b8.m_X3;
      local_408[lVar1].m_Y3 = local_4b8.m_Y3;
      local_648 = local_648 + 1;
    }
    if ((in_EDX & 2) != 0) {
      IGraphics::CFreeformItem::CFreeformItem
                (&local_4d8,(*in_RDI + in_RDI[2]) - in_XMM0_Da,in_RDI[1] + in_XMM0_Da,
                 fVar4 * in_XMM0_Da + ((*in_RDI + in_RDI[2]) - in_XMM0_Da),
                 (1.0 - fVar7) * in_XMM0_Da + in_RDI[1],
                 fVar6 * in_XMM0_Da + ((*in_RDI + in_RDI[2]) - in_XMM0_Da),
                 (1.0 - fVar3) * in_XMM0_Da + in_RDI[1],
                 fVar5 * in_XMM0_Da + ((*in_RDI + in_RDI[2]) - in_XMM0_Da),
                 (1.0 - fVar2) * in_XMM0_Da + in_RDI[1]);
      lVar1 = (long)(int)local_648;
      local_408[lVar1].m_X0 = local_4d8.m_X0;
      local_408[lVar1].m_Y0 = local_4d8.m_Y0;
      local_408[lVar1].m_X1 = local_4d8.m_X1;
      local_408[lVar1].m_Y1 = local_4d8.m_Y1;
      local_408[lVar1].m_X2 = local_4d8.m_X2;
      local_408[lVar1].m_Y2 = local_4d8.m_Y2;
      local_408[lVar1].m_X3 = local_4d8.m_X3;
      local_408[lVar1].m_Y3 = local_4d8.m_Y3;
      local_648 = local_648 + 1;
    }
    if ((in_EDX & 4) != 0) {
      IGraphics::CFreeformItem::CFreeformItem
                (&local_4f8,*in_RDI + in_XMM0_Da,(in_RDI[1] + in_RDI[3]) - in_XMM0_Da,
                 (1.0 - fVar4) * in_XMM0_Da + *in_RDI,
                 fVar7 * in_XMM0_Da + ((in_RDI[1] + in_RDI[3]) - in_XMM0_Da),
                 (1.0 - fVar6) * in_XMM0_Da + *in_RDI,
                 fVar3 * in_XMM0_Da + ((in_RDI[1] + in_RDI[3]) - in_XMM0_Da),
                 (1.0 - fVar5) * in_XMM0_Da + *in_RDI,
                 fVar2 * in_XMM0_Da + ((in_RDI[1] + in_RDI[3]) - in_XMM0_Da));
      lVar1 = (long)(int)local_648;
      local_408[lVar1].m_X0 = local_4f8.m_X0;
      local_408[lVar1].m_Y0 = local_4f8.m_Y0;
      local_408[lVar1].m_X1 = local_4f8.m_X1;
      local_408[lVar1].m_Y1 = local_4f8.m_Y1;
      local_408[lVar1].m_X2 = local_4f8.m_X2;
      local_408[lVar1].m_Y2 = local_4f8.m_Y2;
      local_408[lVar1].m_X3 = local_4f8.m_X3;
      local_408[lVar1].m_Y3 = local_4f8.m_Y3;
      local_648 = local_648 + 1;
    }
    if ((in_EDX & 8) != 0) {
      IGraphics::CFreeformItem::CFreeformItem
                (&local_518,(*in_RDI + in_RDI[2]) - in_XMM0_Da,(in_RDI[1] + in_RDI[3]) - in_XMM0_Da,
                 fVar4 * in_XMM0_Da + ((*in_RDI + in_RDI[2]) - in_XMM0_Da),
                 fVar7 * in_XMM0_Da + ((in_RDI[1] + in_RDI[3]) - in_XMM0_Da),
                 fVar6 * in_XMM0_Da + ((*in_RDI + in_RDI[2]) - in_XMM0_Da),
                 fVar3 * in_XMM0_Da + ((in_RDI[1] + in_RDI[3]) - in_XMM0_Da),
                 fVar5 * in_XMM0_Da + ((*in_RDI + in_RDI[2]) - in_XMM0_Da),
                 fVar2 * in_XMM0_Da + ((in_RDI[1] + in_RDI[3]) - in_XMM0_Da));
      lVar1 = (long)(int)local_648;
      local_408[lVar1].m_X0 = local_518.m_X0;
      local_408[lVar1].m_Y0 = local_518.m_Y0;
      local_408[lVar1].m_X1 = local_518.m_X1;
      local_408[lVar1].m_Y1 = local_518.m_Y1;
      local_408[lVar1].m_X2 = local_518.m_X2;
      local_408[lVar1].m_Y2 = local_518.m_Y2;
      local_408[lVar1].m_X3 = local_518.m_X3;
      local_408[lVar1].m_Y3 = local_518.m_Y3;
      local_648 = local_648 + 1;
    }
    if ((in_EDX & 0x10) != 0) {
      IGraphics::CFreeformItem::CFreeformItem
                (&local_538,*in_RDI,in_RDI[1],(1.0 - fVar4) * in_XMM0_Da + *in_RDI,
                 fVar7 * in_XMM0_Da + (in_RDI[1] - in_XMM0_Da),(1.0 - fVar6) * in_XMM0_Da + *in_RDI,
                 fVar3 * in_XMM0_Da + (in_RDI[1] - in_XMM0_Da),(1.0 - fVar5) * in_XMM0_Da + *in_RDI,
                 fVar2 * in_XMM0_Da + (in_RDI[1] - in_XMM0_Da));
      lVar1 = (long)(int)local_648;
      local_408[lVar1].m_X0 = local_538.m_X0;
      local_408[lVar1].m_Y0 = local_538.m_Y0;
      local_408[lVar1].m_X1 = local_538.m_X1;
      local_408[lVar1].m_Y1 = local_538.m_Y1;
      local_408[lVar1].m_X2 = local_538.m_X2;
      local_408[lVar1].m_Y2 = local_538.m_Y2;
      local_408[lVar1].m_X3 = local_538.m_X3;
      local_408[lVar1].m_Y3 = local_538.m_Y3;
      local_648 = local_648 + 1;
    }
    if ((in_EDX & 0x20) != 0) {
      IGraphics::CFreeformItem::CFreeformItem
                (&local_558,*in_RDI + in_RDI[2],in_RDI[1],
                 fVar4 * in_XMM0_Da + ((*in_RDI + in_RDI[2]) - in_XMM0_Da),
                 fVar7 * in_XMM0_Da + (in_RDI[1] - in_XMM0_Da),
                 fVar6 * in_XMM0_Da + ((*in_RDI + in_RDI[2]) - in_XMM0_Da),
                 fVar3 * in_XMM0_Da + (in_RDI[1] - in_XMM0_Da),
                 fVar5 * in_XMM0_Da + ((*in_RDI + in_RDI[2]) - in_XMM0_Da),
                 fVar2 * in_XMM0_Da + (in_RDI[1] - in_XMM0_Da));
      lVar1 = (long)(int)local_648;
      local_408[lVar1].m_X0 = local_558.m_X0;
      local_408[lVar1].m_Y0 = local_558.m_Y0;
      local_408[lVar1].m_X1 = local_558.m_X1;
      local_408[lVar1].m_Y1 = local_558.m_Y1;
      local_408[lVar1].m_X2 = local_558.m_X2;
      local_408[lVar1].m_Y2 = local_558.m_Y2;
      local_408[lVar1].m_X3 = local_558.m_X3;
      local_408[lVar1].m_Y3 = local_558.m_Y3;
      local_648 = local_648 + 1;
    }
    if ((in_EDX & 0x40) != 0) {
      IGraphics::CFreeformItem::CFreeformItem
                (&local_578,*in_RDI,in_RDI[1] + in_RDI[3],(1.0 - fVar4) * in_XMM0_Da + *in_RDI,
                 (1.0 - fVar7) * in_XMM0_Da + in_RDI[1] + in_RDI[3],
                 (1.0 - fVar6) * in_XMM0_Da + *in_RDI,
                 (1.0 - fVar3) * in_XMM0_Da + in_RDI[1] + in_RDI[3],
                 (1.0 - fVar5) * in_XMM0_Da + *in_RDI,
                 (1.0 - fVar2) * in_XMM0_Da + in_RDI[1] + in_RDI[3]);
      lVar1 = (long)(int)local_648;
      local_408[lVar1].m_X0 = local_578.m_X0;
      local_408[lVar1].m_Y0 = local_578.m_Y0;
      local_408[lVar1].m_X1 = local_578.m_X1;
      local_408[lVar1].m_Y1 = local_578.m_Y1;
      local_408[lVar1].m_X2 = local_578.m_X2;
      local_408[lVar1].m_Y2 = local_578.m_Y2;
      local_408[lVar1].m_X3 = local_578.m_X3;
      local_408[lVar1].m_Y3 = local_578.m_Y3;
      local_648 = local_648 + 1;
    }
    if ((in_EDX & 0x80) != 0) {
      IGraphics::CFreeformItem::CFreeformItem
                (&local_598,*in_RDI + in_RDI[2],in_RDI[1] + in_RDI[3],
                 fVar4 * in_XMM0_Da + ((*in_RDI + in_RDI[2]) - in_XMM0_Da),
                 (1.0 - fVar7) * in_XMM0_Da + in_RDI[1] + in_RDI[3],
                 fVar6 * in_XMM0_Da + ((*in_RDI + in_RDI[2]) - in_XMM0_Da),
                 (1.0 - fVar3) * in_XMM0_Da + in_RDI[1] + in_RDI[3],
                 fVar5 * in_XMM0_Da + ((*in_RDI + in_RDI[2]) - in_XMM0_Da),
                 (1.0 - fVar2) * in_XMM0_Da + in_RDI[1] + in_RDI[3]);
      lVar1 = (long)(int)local_648;
      local_408[lVar1].m_X0 = local_598.m_X0;
      local_408[lVar1].m_Y0 = local_598.m_Y0;
      local_408[lVar1].m_X1 = local_598.m_X1;
      local_408[lVar1].m_Y1 = local_598.m_Y1;
      local_408[lVar1].m_X2 = local_598.m_X2;
      local_408[lVar1].m_Y2 = local_598.m_Y2;
      local_408[lVar1].m_X3 = local_598.m_X3;
      local_408[lVar1].m_Y3 = local_598.m_Y3;
      local_648 = local_648 + 1;
    }
  }
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,local_408,(ulong)local_648);
  local_6a0 = local_498;
  do {
    IGraphics::CQuadItem::CQuadItem(local_6a0);
    local_6a0 = local_6a0 + 1;
  } while ((CFreeformItem *)local_6a0 != local_408);
  IGraphics::CQuadItem::CQuadItem
            (&local_5a8,*in_RDI + in_XMM0_Da,in_RDI[1] + in_XMM0_Da,
             -in_XMM0_Da + -in_XMM0_Da + in_RDI[2],-in_XMM0_Da + -in_XMM0_Da + in_RDI[3]);
  local_498[0].m_X = local_5a8.m_X;
  local_498[0].m_Y = local_5a8.m_Y;
  local_498[0].m_Width = local_5a8.m_Width;
  local_498[0].m_Height = local_5a8.m_Height;
  IGraphics::CQuadItem::CQuadItem
            (&local_5b8,*in_RDI + in_XMM0_Da,in_RDI[1],-in_XMM0_Da + -in_XMM0_Da + in_RDI[2],
             in_XMM0_Da);
  local_498[1].m_X = local_5b8.m_X;
  local_498[1].m_Y = local_5b8.m_Y;
  local_498[1].m_Width = local_5b8.m_Width;
  local_498[1].m_Height = local_5b8.m_Height;
  IGraphics::CQuadItem::CQuadItem
            (&local_5c8,*in_RDI + in_XMM0_Da,(in_RDI[1] + in_RDI[3]) - in_XMM0_Da,
             -in_XMM0_Da + -in_XMM0_Da + in_RDI[2],in_XMM0_Da);
  local_498[2].m_X = local_5c8.m_X;
  local_498[2].m_Y = local_5c8.m_Y;
  local_498[2].m_Width = local_5c8.m_Width;
  local_498[2].m_Height = local_5c8.m_Height;
  IGraphics::CQuadItem::CQuadItem
            (&local_5d8,*in_RDI,in_RDI[1] + in_XMM0_Da,in_XMM0_Da,
             -in_XMM0_Da + -in_XMM0_Da + in_RDI[3]);
  local_498[3].m_X = local_5d8.m_X;
  local_498[3].m_Y = local_5d8.m_Y;
  local_498[3].m_Width = local_5d8.m_Width;
  local_498[3].m_Height = local_5d8.m_Height;
  IGraphics::CQuadItem::CQuadItem
            (&local_5e8,(*in_RDI + in_RDI[2]) - in_XMM0_Da,in_RDI[1] + in_XMM0_Da,in_XMM0_Da,
             -in_XMM0_Da + -in_XMM0_Da + in_RDI[3]);
  local_674 = 5;
  CStack_458.m_X = local_5e8.m_X;
  CStack_458.m_Y = local_5e8.m_Y;
  CStack_458.m_Width = local_5e8.m_Width;
  CStack_458.m_Height = local_5e8.m_Height;
  if ((in_EDX & 1) == 0) {
    IGraphics::CQuadItem::CQuadItem(&local_5f8,*in_RDI,in_RDI[1],in_XMM0_Da,in_XMM0_Da);
    local_674 = 6;
    aCStack_448[0].m_X = local_5f8.m_X;
    aCStack_448[0].m_Y = local_5f8.m_Y;
    aCStack_448[0].m_Width = local_5f8.m_Width;
    aCStack_448[0].m_Height = local_5f8.m_Height;
  }
  if ((in_EDX & 2) == 0) {
    IGraphics::CQuadItem::CQuadItem(&local_608,*in_RDI + in_RDI[2],in_RDI[1],-in_XMM0_Da,in_XMM0_Da)
    ;
    local_498[(int)local_674].m_X = local_608.m_X;
    local_498[(int)local_674].m_Y = local_608.m_Y;
    local_498[(int)local_674].m_Width = local_608.m_Width;
    local_498[(int)local_674].m_Height = local_608.m_Height;
    local_674 = local_674 + 1;
  }
  if ((in_EDX & 4) == 0) {
    IGraphics::CQuadItem::CQuadItem(&local_618,*in_RDI,in_RDI[1] + in_RDI[3],in_XMM0_Da,-in_XMM0_Da)
    ;
    local_498[(int)local_674].m_X = local_618.m_X;
    local_498[(int)local_674].m_Y = local_618.m_Y;
    local_498[(int)local_674].m_Width = local_618.m_Width;
    local_498[(int)local_674].m_Height = local_618.m_Height;
    local_674 = local_674 + 1;
  }
  if ((in_EDX & 8) == 0) {
    IGraphics::CQuadItem::CQuadItem
              (&local_628,*in_RDI + in_RDI[2],in_RDI[1] + in_RDI[3],-in_XMM0_Da,-in_XMM0_Da);
    local_498[(int)local_674].m_X = local_628.m_X;
    local_498[(int)local_674].m_Y = local_628.m_Y;
    local_498[(int)local_674].m_Width = local_628.m_Width;
    local_498[(int)local_674].m_Height = local_628.m_Height;
    local_674 = local_674 + 1;
  }
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,local_498,(ulong)local_674);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CUIRect::Draw(const vec4 &Color, float Rounding, int Corners) const
{
	s_pGraphics->TextureClear();

	// TODO: FIX US
	s_pGraphics->QuadsBegin();
	s_pGraphics->SetColor(Color.r*Color.a, Color.g*Color.a, Color.b*Color.a, Color.a);

	const float r = Rounding;

	IGraphics::CFreeformItem a_FreeformItems[NUM_ROUND_CORNER_SEGMENTS/2*8];
	int NumFreeformItems = 0;
	for(int i = 0; i < NUM_ROUND_CORNER_SEGMENTS; i += 2)
	{
		float a1 = i/s_CornerAnglePerSegment;
		float a2 = (i+1)/s_CornerAnglePerSegment;
		float a3 = (i+2)/s_CornerAnglePerSegment;
		float Ca1 = cosf(a1);
		float Ca2 = cosf(a2);
		float Ca3 = cosf(a3);
		float Sa1 = sinf(a1);
		float Sa2 = sinf(a2);
		float Sa3 = sinf(a3);

		if(Corners&CORNER_TL)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+r, y+r,
				x+(1-Ca1)*r, y+(1-Sa1)*r,
				x+(1-Ca3)*r, y+(1-Sa3)*r,
				x+(1-Ca2)*r, y+(1-Sa2)*r);

		if(Corners&CORNER_TR)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+w-r, y+r,
				x+w-r+Ca1*r, y+(1-Sa1)*r,
				x+w-r+Ca3*r, y+(1-Sa3)*r,
				x+w-r+Ca2*r, y+(1-Sa2)*r);

		if(Corners&CORNER_BL)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+r, y+h-r,
				x+(1-Ca1)*r, y+h-r+Sa1*r,
				x+(1-Ca3)*r, y+h-r+Sa3*r,
				x+(1-Ca2)*r, y+h-r+Sa2*r);

		if(Corners&CORNER_BR)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+w-r, y+h-r,
				x+w-r+Ca1*r, y+h-r+Sa1*r,
				x+w-r+Ca3*r, y+h-r+Sa3*r,
				x+w-r+Ca2*r, y+h-r+Sa2*r);

		if(Corners&CORNER_ITL)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x, y,
				x+(1-Ca1)*r, y-r+Sa1*r,
				x+(1-Ca3)*r, y-r+Sa3*r,
				x+(1-Ca2)*r, y-r+Sa2*r);

		if(Corners&CORNER_ITR)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+w, y,
				x+w-r+Ca1*r, y-r+Sa1*r,
				x+w-r+Ca3*r, y-r+Sa3*r,
				x+w-r+Ca2*r, y-r+Sa2*r);

		if(Corners&CORNER_IBL)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x, y+h,
				x+(1-Ca1)*r, y+h+(1-Sa1)*r,
				x+(1-Ca3)*r, y+h+(1-Sa3)*r,
				x+(1-Ca2)*r, y+h+(1-Sa2)*r);

		if(Corners&CORNER_IBR)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+w, y+h,
				x+w-r+Ca1*r, y+h+(1-Sa1)*r,
				x+w-r+Ca3*r, y+h+(1-Sa3)*r,
				x+w-r+Ca2*r, y+h+(1-Sa2)*r);
	}
	s_pGraphics->QuadsDrawFreeform(a_FreeformItems, NumFreeformItems);

	IGraphics::CQuadItem a_QuadItems[9];
	int NumQuadItems = 0;
	a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+r, y+r, w-r*2, h-r*2); // center
	a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+r, y, w-r*2, r); // top
	a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+r, y+h-r, w-r*2, r); // bottom
	a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x, y+r, r, h-r*2); // left
	a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+w-r, y+r, r, h-r*2); // right

	if(!(Corners&CORNER_TL)) a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x, y, r, r);
	if(!(Corners&CORNER_TR)) a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+w, y, -r, r);
	if(!(Corners&CORNER_BL)) a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x, y+h, r, -r);
	if(!(Corners&CORNER_BR)) a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+w, y+h, -r, -r);

	s_pGraphics->QuadsDrawTL(a_QuadItems, NumQuadItems);
	s_pGraphics->QuadsEnd();
}